

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsAppsExport.cpp
# Opt level: O3

HelicsFederate helicsAppGetFederate(HelicsApp app,HelicsError *err)

{
  element_type *peVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  AppObject *pAVar3;
  HelicsFederate pvVar4;
  shared_ptr<helics::Federate> local_20;
  
  pAVar3 = helics::getAppObject(app,err);
  if ((pAVar3 == (AppObject *)0x0) ||
     (peVar1 = (pAVar3->app).super___shared_ptr<helics::apps::App,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr, peVar1 == (element_type *)0x0)) {
    pvVar4 = (HelicsFederate)0x0;
  }
  else {
    peVar2 = (peVar1->fed).
             super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_20.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (peVar1->fed).super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_20.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_20.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        )->_M_use_count =
             (local_20.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_20.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        )->_M_use_count =
             (local_20.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    if (peVar2 == (element_type *)0x0) {
      local_20.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    else {
      local_20.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate +
           (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[0xfffffffffffffffd]);
    }
    pvVar4 = generateNewHelicsFederateObject(&local_20,COMBINATION);
    if (local_20.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_20.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  return pvVar4;
}

Assistant:

HelicsFederate helicsAppGetFederate(HelicsApp app, HelicsError* err)
{
    auto* happ = getApp(app, err);
    if (happ == nullptr) {
        return nullptr;
    }
    try {
        return generateNewHelicsFederateObject(happ->getUnderlyingFederatePointer(), helics::FederateType::COMBINATION);
    }
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }
}